

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawable.cpp
# Opt level: O0

int main(void)

{
  Square local_51;
  poly<Drawable,_te::v1::dynamic_storage,_te::v1::dynamic_vtable> local_50;
  Circle local_21;
  poly<Drawable,_te::v1::dynamic_storage,_te::v1::dynamic_vtable> local_20;
  
  te::v1::poly<Drawable,te::v1::dynamic_storage,te::v1::dynamic_vtable>::poly<Circle,void>
            ((poly<Drawable,te::v1::dynamic_storage,te::v1::dynamic_vtable> *)&local_20,&local_21);
  draw(&local_20);
  te::v1::poly<Drawable,_te::v1::dynamic_storage,_te::v1::dynamic_vtable>::~poly(&local_20);
  te::v1::poly<Drawable,te::v1::dynamic_storage,te::v1::dynamic_vtable>::poly<Square,void>
            ((poly<Drawable,te::v1::dynamic_storage,te::v1::dynamic_vtable> *)&local_50,&local_51);
  draw(&local_50);
  te::v1::poly<Drawable,_te::v1::dynamic_storage,_te::v1::dynamic_vtable>::~poly(&local_50);
  return 0;
}

Assistant:

int main() {
  draw(Circle{});  // prints Circle
  draw(Square{});  // prints Square
}